

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O0

MppBuffer h264e_vepu_buf_get_nal_size_table(HalH264eVepuBufs *bufs)

{
  MppBuffer local_18;
  MppBuffer buf;
  HalH264eVepuBufs *bufs_local;
  
  local_18 = bufs->nal_size_table;
  buf = bufs;
  if ((hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter %p\n","h264e_vepu_buf_get_nal_size_table",bufs);
  }
  if (local_18 == (MppBuffer)0x0) {
    mpp_buffer_get_with_tag
              (*buf,&local_18,(long)*(int *)((long)buf + 0x1c),"hal_h264e_vepu_v2",
               "h264e_vepu_buf_get_nal_size_table");
    if ((local_18 == (MppBuffer)0x0) &&
       (_mpp_log_l(2,"hal_h264e_vepu_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"buf",
                   "h264e_vepu_buf_get_nal_size_table",0x114), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    *(MppBuffer *)((long)buf + 0x20) = local_18;
  }
  if ((hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave %p\n","h264e_vepu_buf_get_nal_size_table",buf);
  }
  return local_18;
}

Assistant:

MppBuffer h264e_vepu_buf_get_nal_size_table(HalH264eVepuBufs *bufs)
{
    MppBuffer buf = bufs->nal_size_table;

    hal_h264e_dbg_buffer("enter %p\n", bufs);

    if (NULL == buf) {
        mpp_buffer_get(bufs->group, &buf, bufs->nal_tab_size);
        mpp_assert(buf);
        bufs->nal_size_table = buf;
    }

    hal_h264e_dbg_buffer("leave %p\n", bufs);

    return buf;
}